

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O0

Expression * __thiscall
slang::ast::SimpleSystemSubroutine::bindArgument
          (SimpleSystemSubroutine *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax
          ,Args *args)

{
  size_type sVar1;
  size_t in_RCX;
  SystemSubroutine *in_RDX;
  ulong in_RSI;
  Args *in_RDI;
  ASTContext *in_R8;
  Type *in_stack_00000050;
  bitmask<slang::ast::VariableFlags> in_stack_0000005e;
  ExpressionSyntax *in_stack_ffffffffffffffc8;
  ulong local_18;
  Expression *local_8;
  
  local_18 = in_RSI;
  if (((ulong)in_RDI[6]._M_ptr & 1) != 0) {
    local_18 = in_RSI - 1;
  }
  sVar1 = std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::size
                    ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
                     &in_RDI[3]._M_extent);
  if (local_18 < sVar1) {
    std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::operator[]
              ((vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *)
               &in_RDI[3]._M_extent,local_18);
    memset(&stack0xffffffffffffffce,0,2);
    bitmask<slang::ast::VariableFlags>::bitmask
              ((bitmask<slang::ast::VariableFlags> *)&stack0xffffffffffffffce);
    local_8 = Expression::bindArgument
                        (in_stack_00000050,this._4_4_,in_stack_0000005e,(ExpressionSyntax *)argIndex
                         ,context);
  }
  else {
    local_8 = SystemSubroutine::bindArgument(in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffc8,in_RDI);
  }
  return local_8;
}

Assistant:

const Expression& SimpleSystemSubroutine::bindArgument(size_t argIndex, const ASTContext& context,
                                                       const ExpressionSyntax& syntax,
                                                       const Args& args) const {
    if (isMethod)
        argIndex--;

    if (argIndex >= argTypes.size())
        return SystemSubroutine::bindArgument(argIndex, context, syntax, args);

    return Expression::bindArgument(*argTypes[argIndex], ArgumentDirection::In, {}, syntax,
                                    context);
}